

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spookyv2.cpp
# Opt level: O1

void __thiscall SpookyHash::Update(SpookyHash *this,void *message,size_t length)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  long *__src;
  ulong uVar6;
  size_t __n;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  uint64 uVar10;
  ulong uVar11;
  ulong uVar12;
  uint64 uVar13;
  ulong uVar14;
  ulong uVar15;
  uint64 uVar16;
  uint64 uVar17;
  ulong uVar18;
  ulong local_78;
  ulong local_70;
  ulong local_68;
  ulong local_60;
  ulong local_58;
  
  uVar2 = (ulong)this->m_remainder;
  if (uVar2 + length < 0xc0) {
    memcpy((void *)((long)this->m_data + uVar2),message,length);
    this->m_length = this->m_length + length;
    this->m_remainder = (uint8)(uVar2 + length);
  }
  else {
    local_60 = this->m_state[0];
    uVar7 = this->m_state[1];
    if (this->m_length < 0xc0) {
      uVar10 = 0xdeadbeefdeadbeef;
      local_70 = 0xdeadbeefdeadbeef;
      uVar17 = 0xdeadbeefdeadbeef;
      local_58 = 0xdeadbeefdeadbeef;
      local_68 = uVar7;
      uVar4 = uVar7;
      uVar5 = local_60;
      uVar13 = uVar7;
      uVar16 = local_60;
      local_78 = local_60;
    }
    else {
      local_58 = this->m_state[2];
      local_78 = this->m_state[3];
      local_68 = this->m_state[4];
      local_70 = this->m_state[5];
      uVar16 = this->m_state[6];
      uVar4 = this->m_state[7];
      uVar17 = this->m_state[8];
      uVar5 = this->m_state[9];
      uVar13 = this->m_state[10];
      uVar10 = this->m_state[0xb];
    }
    this->m_length = this->m_length + length;
    if (uVar2 != 0) {
      uVar12 = (ulong)(byte)(-this->m_remainder - 0x40);
      memcpy((void *)((long)this->m_data + uVar2),message,uVar12);
      local_60 = local_60 + this->m_data[0];
      uVar11 = (uVar10 ^ local_60) + uVar7;
      uVar7 = uVar7 + this->m_data[1];
      uVar6 = ((local_60 * 0x800 | local_60 >> 0x35) ^ uVar7) + (local_58 ^ uVar13);
      uVar8 = (local_58 ^ uVar13) + this->m_data[2];
      uVar2 = local_78 ^ uVar11;
      uVar7 = ((uVar7 << 0x20 | uVar7 >> 0x20) ^ uVar8) + uVar2;
      uVar2 = uVar2 + this->m_data[3];
      local_68 = local_68 ^ uVar6;
      uVar9 = ((uVar8 << 0x2b | uVar8 >> 0x15) ^ uVar2) + local_68;
      local_68 = local_68 + this->m_data[4];
      local_70 = local_70 ^ uVar7;
      uVar2 = ((uVar2 * 0x80000000 | uVar2 >> 0x21) ^ local_68) + local_70;
      local_70 = local_70 + this->m_data[5];
      uVar14 = uVar16 ^ uVar9;
      uVar8 = ((local_68 * 0x20000 | local_68 >> 0x2f) ^ local_70) + uVar14;
      uVar14 = uVar14 + this->m_data[6];
      uVar4 = uVar4 ^ uVar2;
      uVar3 = ((local_70 * 0x10000000 | local_70 >> 0x24) ^ uVar14) + uVar4;
      uVar4 = uVar4 + this->m_data[7];
      uVar18 = uVar17 ^ uVar8;
      uVar15 = ((uVar14 << 0x27 | uVar14 >> 0x19) ^ uVar4) + uVar18;
      uVar18 = uVar18 + this->m_data[8];
      uVar5 = uVar5 ^ uVar3;
      uVar4 = ((uVar4 << 0x39 | uVar4 >> 7) ^ uVar18) + uVar5;
      uVar5 = uVar5 + this->m_data[9];
      uVar14 = uVar13 ^ uVar15;
      uVar18 = ((uVar18 << 0x37 | uVar18 >> 9) ^ uVar5) + uVar14;
      uVar14 = uVar14 + this->m_data[10];
      uVar11 = uVar11 ^ uVar4;
      uVar5 = ((uVar5 << 0x36 | uVar5 >> 10) ^ uVar14) + uVar11;
      uVar11 = uVar11 + this->m_data[0xb];
      uVar6 = uVar6 ^ uVar18;
      uVar14 = ((uVar14 * 0x400000 | uVar14 >> 0x2a) ^ uVar11) + uVar6;
      uVar6 = uVar6 + this->m_data[0xc];
      uVar7 = uVar7 ^ uVar5;
      uVar11 = ((uVar11 << 0x2e | uVar11 >> 0x12) ^ uVar6) + uVar7;
      uVar7 = uVar7 + this->m_data[0xd];
      uVar9 = uVar9 ^ uVar14;
      local_60 = ((uVar6 * 0x800 | uVar6 >> 0x35) ^ uVar7) + uVar9;
      uVar9 = uVar9 + this->m_data[0xe];
      uVar2 = uVar2 ^ uVar11;
      uVar7 = ((uVar7 << 0x20 | uVar7 >> 0x20) ^ uVar9) + uVar2;
      uVar2 = uVar2 + this->m_data[0xf];
      uVar8 = uVar8 ^ local_60;
      local_58 = ((uVar9 << 0x2b | uVar9 >> 0x15) ^ uVar2) + uVar8;
      uVar8 = uVar8 + this->m_data[0x10];
      uVar3 = uVar3 ^ uVar7;
      local_78 = ((uVar2 * 0x80000000 | uVar2 >> 0x21) ^ uVar8) + uVar3;
      uVar3 = uVar3 + this->m_data[0x11];
      uVar15 = uVar15 ^ local_58;
      local_68 = ((uVar8 * 0x20000 | uVar8 >> 0x2f) ^ uVar3) + uVar15;
      uVar15 = uVar15 + this->m_data[0x12];
      uVar4 = uVar4 ^ local_78;
      local_70 = ((uVar3 * 0x10000000 | uVar3 >> 0x24) ^ uVar15) + uVar4;
      uVar4 = uVar4 + this->m_data[0x13];
      uVar18 = uVar18 ^ local_68;
      uVar16 = ((uVar15 << 0x27 | uVar15 >> 0x19) ^ uVar4) + uVar18;
      uVar18 = uVar18 + this->m_data[0x14];
      message = (void *)((long)message + uVar12);
      length = length - uVar12;
      uVar5 = uVar5 ^ local_70;
      uVar4 = ((uVar4 << 0x39 | uVar4 >> 7) ^ uVar18) + uVar5;
      uVar5 = uVar5 + this->m_data[0x15];
      uVar14 = uVar14 ^ uVar16;
      uVar11 = uVar11 ^ uVar4;
      uVar17 = ((uVar18 << 0x37 | uVar18 >> 9) ^ uVar5) + uVar14;
      uVar14 = uVar14 + this->m_data[0x16];
      local_60 = local_60 ^ uVar17;
      uVar5 = ((uVar5 << 0x36 | uVar5 >> 10) ^ uVar14) + uVar11;
      uVar11 = uVar11 + this->m_data[0x17];
      uVar7 = uVar7 ^ uVar5;
      uVar10 = uVar11 << 0x2e | uVar11 >> 0x12;
      uVar13 = ((uVar14 * 0x400000 | uVar14 >> 0x2a) ^ uVar11) + local_60;
    }
    uVar2 = length / 3 & 0xffffffffffffffe0;
    lVar1 = uVar2 * 3;
    __n = length + uVar2 * -3;
    __src = (long *)((long)message + lVar1);
    if (0 < lVar1) {
      do {
        local_60 = local_60 + *message;
        uVar12 = (uVar10 ^ local_60) + uVar7;
        uVar7 = uVar7 + *(long *)((long)message + 8);
        local_60 = ((local_60 * 0x800 | local_60 >> 0x35) ^ uVar7) + (local_58 ^ uVar13);
        uVar8 = (local_58 ^ uVar13) + *(long *)((long)message + 0x10);
        uVar2 = local_78 ^ uVar12;
        uVar7 = ((uVar7 << 0x20 | uVar7 >> 0x20) ^ uVar8) + uVar2;
        uVar2 = uVar2 + *(long *)((long)message + 0x18);
        local_68 = local_68 ^ local_60;
        local_58 = ((uVar8 << 0x2b | uVar8 >> 0x15) ^ uVar2) + local_68;
        local_68 = local_68 + *(long *)((long)message + 0x20);
        local_70 = local_70 ^ uVar7;
        local_78 = ((uVar2 * 0x80000000 | uVar2 >> 0x21) ^ local_68) + local_70;
        local_70 = local_70 + *(long *)((long)message + 0x28);
        local_68 = ((local_68 * 0x20000 | local_68 >> 0x2f) ^ local_70) + (uVar16 ^ local_58);
        uVar8 = (uVar16 ^ local_58) + *(long *)((long)message + 0x30);
        local_70 = ((local_70 * 0x10000000 | local_70 >> 0x24) ^ uVar8) + (uVar4 ^ local_78);
        uVar2 = (uVar4 ^ local_78) + *(long *)((long)message + 0x38);
        uVar16 = ((uVar8 << 0x27 | uVar8 >> 0x19) ^ uVar2) + (uVar17 ^ local_68);
        uVar8 = (uVar17 ^ local_68) + *(long *)((long)message + 0x40);
        uVar4 = ((uVar2 << 0x39 | uVar2 >> 7) ^ uVar8) + (uVar5 ^ local_70);
        uVar2 = (uVar5 ^ local_70) + *(long *)((long)message + 0x48);
        uVar17 = ((uVar8 << 0x37 | uVar8 >> 9) ^ uVar2) + (uVar13 ^ uVar16);
        uVar8 = (uVar13 ^ uVar16) + *(long *)((long)message + 0x50);
        uVar12 = uVar12 ^ uVar4;
        uVar5 = ((uVar2 << 0x36 | uVar2 >> 10) ^ uVar8) + uVar12;
        uVar12 = uVar12 + *(long *)((long)message + 0x58);
        local_60 = local_60 ^ uVar17;
        uVar10 = uVar12 << 0x2e | uVar12 >> 0x12;
        uVar7 = uVar7 ^ uVar5;
        uVar13 = ((uVar8 * 0x400000 | uVar8 >> 0x2a) ^ uVar12) + local_60;
        message = (void *)((long)message + 0x60);
      } while (message < __src);
    }
    this->m_remainder = (uint8)__n;
    memcpy(this,__src,__n);
    this->m_state[0] = local_60;
    this->m_state[1] = uVar7;
    this->m_state[2] = local_58;
    this->m_state[3] = local_78;
    this->m_state[4] = local_68;
    this->m_state[5] = local_70;
    this->m_state[6] = uVar16;
    this->m_state[7] = uVar4;
    this->m_state[8] = uVar17;
    this->m_state[9] = uVar5;
    this->m_state[10] = uVar13;
    this->m_state[0xb] = uVar10;
  }
  return;
}

Assistant:

void SpookyHash::Update(const void *message, size_t length)
{
    uint64 h0,h1,h2,h3,h4,h5,h6,h7,h8,h9,h10,h11;
    size_t newLength = length + m_remainder;
    uint8  remainder;
    union
    {
        const uint8 *p8;
        uint64 *p64;
        size_t i;
    } u;
    const uint64 *end;

    // Is this message fragment too short?  If it is, stuff it away.
    if (newLength < sc_bufSize)
    {
        memcpy(&((uint8 *)m_data)[m_remainder], message, length);
        m_length = length + m_length;
        m_remainder = (uint8)newLength;
        return;
    }

    // init the variables
    if (m_length < sc_bufSize)
    {
        h0=h3=h6=h9  = m_state[0];
        h1=h4=h7=h10 = m_state[1];
        h2=h5=h8=h11 = sc_const;
    }
    else
    {
        h0 = m_state[0];
        h1 = m_state[1];
        h2 = m_state[2];
        h3 = m_state[3];
        h4 = m_state[4];
        h5 = m_state[5];
        h6 = m_state[6];
        h7 = m_state[7];
        h8 = m_state[8];
        h9 = m_state[9];
        h10 = m_state[10];
        h11 = m_state[11];
    }
    m_length = length + m_length;

    // if we've got anything stuffed away, use it now
    if (m_remainder)
    {
        uint8 prefix = sc_bufSize-m_remainder;
        memcpy(&(((uint8 *)m_data)[m_remainder]), message, prefix);
        u.p64 = m_data;
        Mix(u.p64, h0,h1,h2,h3,h4,h5,h6,h7,h8,h9,h10,h11);
        Mix(&u.p64[sc_numVars], h0,h1,h2,h3,h4,h5,h6,h7,h8,h9,h10,h11);
        u.p8 = ((const uint8 *)message) + prefix;
        length -= prefix;
    }
    else
    {
        u.p8 = (const uint8 *)message;
    }

    // handle all whole blocks of sc_blockSize bytes
    end = u.p64 + (length/sc_blockSize)*sc_numVars;
    remainder = (uint8)(length-((const uint8 *)end-u.p8));
    if (ALLOW_UNALIGNED_READS || (u.i & 0x7) == 0)
    {
        while (u.p64 < end)
        {
            Mix(u.p64, h0,h1,h2,h3,h4,h5,h6,h7,h8,h9,h10,h11);
        u.p64 += sc_numVars;
        }
    }
    else
    {
        while (u.p64 < end)
        {
            memcpy(m_data, u.p8, sc_blockSize);
            Mix(m_data, h0,h1,h2,h3,h4,h5,h6,h7,h8,h9,h10,h11);
        u.p64 += sc_numVars;
        }
    }

    // stuff away the last few bytes
    m_remainder = remainder;
    memcpy(m_data, end, remainder);

    // stuff away the variables
    m_state[0] = h0;
    m_state[1] = h1;
    m_state[2] = h2;
    m_state[3] = h3;
    m_state[4] = h4;
    m_state[5] = h5;
    m_state[6] = h6;
    m_state[7] = h7;
    m_state[8] = h8;
    m_state[9] = h9;
    m_state[10] = h10;
    m_state[11] = h11;
}